

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

Aig_Man_t *
Saig_ManRetimeMinArea
          (Aig_Man_t *p,int nMaxIters,int fForwardOnly,int fBackwardOnly,int fInitial,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Aig_Man_t *pAVar5;
  Aig_Man_t *p_00;
  int local_4c;
  int fChanges;
  int i;
  Aig_Man_t *pCopy;
  Aig_Man_t *pTemp;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vCut;
  int fVerbose_local;
  int fInitial_local;
  int fBackwardOnly_local;
  int fForwardOnly_local;
  int nMaxIters_local;
  Aig_Man_t *p_local;
  
  pTemp = Aig_ManDupSimple(p);
  bVar1 = false;
  if (fBackwardOnly == 0) {
    local_4c = 0;
    while( true ) {
      if ((nMaxIters <= local_4c) || (iVar2 = Saig_ManRegNum(pTemp), iVar2 == 0)) goto LAB_0083cd5a;
      pVVar4 = Nwk_ManDeriveRetimingCut(pTemp,1,fVerbose);
      iVar2 = Vec_PtrSize(pVVar4);
      iVar3 = Aig_ManRegNum(pTemp);
      if (iVar3 <= iVar2) break;
      pAVar5 = Saig_ManRetimeDupForward(pTemp,pVVar4);
      Aig_ManStop(pTemp);
      Vec_PtrFree(pVVar4);
      if (fVerbose != 0) {
        Aig_ManReportImprovement(p,pAVar5);
      }
      bVar1 = true;
      local_4c = local_4c + 1;
      pTemp = pAVar5;
    }
    if ((fVerbose != 0) && (!bVar1)) {
      printf("Forward retiming cannot reduce registers.\n");
    }
    Vec_PtrFree(pVVar4);
  }
LAB_0083cd5a:
  bVar1 = false;
  if ((fForwardOnly == 0) && (fInitial == 0)) {
    local_4c = 0;
    while( true ) {
      if ((nMaxIters <= local_4c) || (iVar2 = Saig_ManRegNum(pTemp), iVar2 == 0)) goto LAB_0083cf33;
      pVVar4 = Nwk_ManDeriveRetimingCut(pTemp,0,fVerbose);
      iVar2 = Vec_PtrSize(pVVar4);
      iVar3 = Aig_ManRegNum(pTemp);
      if (iVar3 <= iVar2) break;
      pAVar5 = Saig_ManRetimeDupBackward(pTemp,pVVar4,(Vec_Int_t *)0x0);
      Aig_ManStop(pTemp);
      Vec_PtrFree(pVVar4);
      if (fVerbose != 0) {
        Aig_ManReportImprovement(p,pAVar5);
      }
      bVar1 = true;
      local_4c = local_4c + 1;
      pTemp = pAVar5;
    }
    if ((fVerbose != 0) && (!bVar1)) {
      printf("Backward retiming cannot reduce registers.\n");
    }
    Vec_PtrFree(pVVar4);
  }
  else if ((fForwardOnly == 0) && (fInitial != 0)) {
    local_4c = 0;
    while( true ) {
      if ((nMaxIters <= local_4c) || (iVar2 = Saig_ManRegNum(pTemp), iVar2 == 0)) goto LAB_0083cf33;
      pAVar5 = Aig_ManDupSimple(pTemp);
      p_00 = Saig_ManRetimeMinAreaBackward(pAVar5,fVerbose);
      Aig_ManStop(pAVar5);
      if (p_00 == (Aig_Man_t *)0x0) break;
      iVar2 = Saig_ManPoNum(p_00);
      iVar3 = Saig_ManPoNum(pTemp);
      Saig_ManExposeBadRegs(p_00,iVar2 - iVar3);
      Aig_ManStop(pTemp);
      if (fVerbose != 0) {
        Aig_ManReportImprovement(p,p_00);
      }
      bVar1 = true;
      local_4c = local_4c + 1;
      pTemp = p_00;
    }
    if ((fVerbose != 0) && (!bVar1)) {
      printf("Backward retiming cannot reduce registers.\n");
    }
  }
LAB_0083cf33:
  if (((fForwardOnly == 0) && (fInitial == 0)) && (bVar1)) {
    printf("Assuming const-0 init-state after backward retiming. Result will not verify.\n");
  }
  return pTemp;
}

Assistant:

Aig_Man_t * Saig_ManRetimeMinArea( Aig_Man_t * p, int nMaxIters, int fForwardOnly, int fBackwardOnly, int fInitial, int fVerbose )
{
    Vec_Ptr_t * vCut;
    Aig_Man_t * pNew, * pTemp, * pCopy;
    int i, fChanges;
    pNew = Aig_ManDupSimple( p );
    // perform several iterations of forward retiming
    fChanges = 0;
    if ( !fBackwardOnly )
    for ( i = 0; i < nMaxIters; i++ )
    {
        if ( Saig_ManRegNum(pNew) == 0 )
            break;
        vCut = Nwk_ManDeriveRetimingCut( pNew, 1, fVerbose );
        if ( Vec_PtrSize(vCut) >= Aig_ManRegNum(pNew) )
        {
            if ( fVerbose && !fChanges )
                printf( "Forward retiming cannot reduce registers.\n" );
            Vec_PtrFree( vCut );
            break;
        }
        pNew = Saig_ManRetimeDupForward( pTemp = pNew, vCut );
        Aig_ManStop( pTemp );
        Vec_PtrFree( vCut );
        if ( fVerbose )
            Aig_ManReportImprovement( p, pNew );
        fChanges = 1;
    }
    // perform several iterations of backward retiming
    fChanges = 0;
    if ( !fForwardOnly && !fInitial )
    for ( i = 0; i < nMaxIters; i++ )
    {
        if ( Saig_ManRegNum(pNew) == 0 )
            break;
        vCut = Nwk_ManDeriveRetimingCut( pNew, 0, fVerbose );
        if ( Vec_PtrSize(vCut) >= Aig_ManRegNum(pNew) )
        {
            if ( fVerbose && !fChanges )
                printf( "Backward retiming cannot reduce registers.\n" );
            Vec_PtrFree( vCut );
            break;
        }
        pNew = Saig_ManRetimeDupBackward( pTemp = pNew, vCut, NULL );
        Aig_ManStop( pTemp );
        Vec_PtrFree( vCut );
        if ( fVerbose )
            Aig_ManReportImprovement( p, pNew );
        fChanges = 1;
    }
    else if ( !fForwardOnly && fInitial )
    for ( i = 0; i < nMaxIters; i++ )
    {
        if ( Saig_ManRegNum(pNew) == 0 )
            break;
        pCopy = Aig_ManDupSimple( pNew );
        pTemp = Saig_ManRetimeMinAreaBackward( pCopy, fVerbose );
        Aig_ManStop( pCopy );
        if ( pTemp == NULL )
        {
            if ( fVerbose && !fChanges )
                printf( "Backward retiming cannot reduce registers.\n" );
            break;
        }
        Saig_ManExposeBadRegs( pTemp, Saig_ManPoNum(pTemp) - Saig_ManPoNum(pNew) );
        Aig_ManStop( pNew );
        pNew = pTemp;
        if ( fVerbose )
            Aig_ManReportImprovement( p, pNew );
        fChanges = 1;
    }
    if ( !fForwardOnly && !fInitial && fChanges )
        printf( "Assuming const-0 init-state after backward retiming. Result will not verify.\n" );
    return pNew;
}